

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O0

void __thiscall mathOps_trigSin_Test::TestBody(mathOps_trigSin_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_3;
  precise_measurement m4;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  precise_measurement m3;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  measurement m2;
  Message local_48 [3];
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  measurement m1;
  mathOps_trigSin_Test *this_local;
  
  units::measurement::measurement
            ((measurement *)&gtest_ar.message_,0.7853981633974483,(unit *)&units::rad);
  dVar3 = units::sin<units::measurement,void>((measurement *)&gtest_ar.message_);
  dVar4 = sin(0.7853981633974483);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_30,"sin(m1)","sin(constants::pi / 4.0)",(float)dVar3,(float)dVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x7c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2.units_,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2.units_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  units::measurement::measurement((measurement *)&gtest_ar_1.message_,45.0,(unit *)&units::deg);
  dVar3 = units::sin<units::measurement,void>((measurement *)&gtest_ar_1.message_);
  dVar4 = sin(0.7853981633974483);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_70,"sin(m2)","sin(constants::pi / 4.0)",(float)dVar3,(float)dVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m3.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x7f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m3.units_.base_units_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m3.units_.base_units_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  units::precise_measurement::precise_measurement
            ((precise_measurement *)&gtest_ar_2.message_,0.7853981633974483,
             (precise_unit *)&units::precise::rad);
  dVar3 = units::sin<units::precise_measurement,void>((precise_measurement *)&gtest_ar_2.message_);
  dVar4 = sin(0.7853981633974483);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_a8,"sin(m3)","sin(constants::pi / 4.0)",dVar3,dVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m4.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x82,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m4.units_.base_units_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m4.units_.base_units_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  units::precise_measurement::precise_measurement
            ((precise_measurement *)&gtest_ar_3.message_,45.0,(precise_unit *)units::precise::deg);
  dVar3 = units::sin<units::precise_measurement,void>((precise_measurement *)&gtest_ar_3.message_);
  dVar4 = sin(0.7853981633974483);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_e0,"sin(m4)","sin(constants::pi / 4.0)",dVar3,dVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x85,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  return;
}

Assistant:

TEST(mathOps, trigSin)
{
    measurement m1(constants::pi / 4.0, rad);
    EXPECT_FLOAT_EQ(sin(m1), sin(constants::pi / 4.0));

    measurement m2(45.0, deg);
    EXPECT_FLOAT_EQ(sin(m2), sin(constants::pi / 4.0));

    precise_measurement m3(constants::pi / 4.0, precise::rad);
    EXPECT_DOUBLE_EQ(sin(m3), sin(constants::pi / 4.0));

    precise_measurement m4(45.0, precise::deg);
    EXPECT_DOUBLE_EQ(sin(m4), sin(constants::pi / 4.0));
}